

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O3

void __thiscall CMU462::MeshResampler::resample(MeshResampler *this,HalfedgeMesh *mesh)

{
  int iVar1;
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *plVar2;
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar3;
  size_t sVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  EdgeIter EVar11;
  _List_node_base *p_Var12;
  uint uVar13;
  int iVar15;
  _List_node_base *p_Var16;
  int iVar17;
  int iVar18;
  EdgeIter EVar19;
  _List_node_base *p_Var20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  Vector3D N;
  Vector3D c;
  Vector3D local_60;
  double local_48;
  double dStack_40;
  double local_38;
  int iVar14;
  
  plVar2 = &mesh->edges;
  dVar22 = 0.0;
  for (p_Var20 = (mesh->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl
                 ._M_node.super__List_node_base._M_next; p_Var20 != (_List_node_base *)plVar2;
      p_Var20 = p_Var20->_M_next) {
    p_Var16 = p_Var20[6]._M_prev[2]._M_prev;
    p_Var12 = p_Var20[6]._M_prev[1]._M_prev[2]._M_prev;
    dVar5 = (double)p_Var12[1]._M_prev - (double)p_Var16[1]._M_prev;
    dVar21 = (double)p_Var12[2]._M_next - (double)p_Var16[2]._M_next;
    dVar23 = (double)p_Var12[2]._M_prev - (double)p_Var16[2]._M_prev;
    dVar22 = dVar22 + SQRT(dVar23 * dVar23 + dVar5 * dVar5 + dVar21 * dVar21);
  }
  sVar4 = (mesh->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
          _M_node._M_size;
  dVar22 = (dVar22 / (((double)CONCAT44(0x45300000,(int)(sVar4 >> 0x20)) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0))) * 4.0;
  plVar3 = &mesh->vertices;
  iVar7 = 0;
  do {
    iVar18 = (int)(mesh->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>.
                  _M_impl._M_node._M_size;
    EVar11._M_node = (_List_node_base *)plVar2;
    if (0 < iVar18) {
      do {
        EVar11._M_node = (EVar11._M_node)->_M_next;
        p_Var20 = EVar11._M_node[6]._M_prev[2]._M_prev;
        p_Var16 = EVar11._M_node[6]._M_prev[1]._M_prev[2]._M_prev;
        dVar5 = (double)p_Var16[1]._M_prev - (double)p_Var20[1]._M_prev;
        dVar21 = (double)p_Var16[2]._M_next - (double)p_Var20[2]._M_next;
        dVar23 = (double)p_Var16[2]._M_prev - (double)p_Var20[2]._M_prev;
        if (dVar22 / 3.0 < SQRT(dVar23 * dVar23 + dVar5 * dVar5 + dVar21 * dVar21)) {
          HalfedgeMesh::splitEdge(mesh,EVar11);
        }
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
    }
    EVar11._M_node =
         (plVar2->super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>)._M_impl._M_node.
         super__List_node_base._M_next;
    do {
      p_Var20 = EVar11._M_node[6]._M_prev;
      p_Var16 = p_Var20[2]._M_prev;
      p_Var12 = p_Var20[1]._M_prev[2]._M_prev;
      dVar5 = (double)p_Var12[1]._M_prev - (double)p_Var16[1]._M_prev;
      dVar21 = (double)p_Var12[2]._M_next - (double)p_Var16[2]._M_next;
      dVar23 = (double)p_Var12[2]._M_prev - (double)p_Var16[2]._M_prev;
      if (dVar22 / 5.0 <= SQRT(dVar23 * dVar23 + dVar5 * dVar5 + dVar21 * dVar21)) {
        EVar11._M_node = (EVar11._M_node)->_M_next;
      }
      else {
        EVar19._M_node = EVar11._M_node;
        do {
          do {
            EVar19._M_node = (EVar19._M_node)->_M_next;
          } while (EVar19._M_node == p_Var20[2]._M_next[2]._M_next[3]._M_next);
        } while (EVar19._M_node == p_Var20[1]._M_prev[2]._M_next[2]._M_next[3]._M_next);
        HalfedgeMesh::collapseEdge(mesh,EVar11);
        EVar11._M_node = EVar19._M_node;
      }
    } while (EVar11._M_node != (_List_node_base *)plVar2);
    for (EVar11._M_node =
              (plVar2->super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>)._M_impl.
              _M_node.super__List_node_base._M_next; EVar11._M_node != (_List_node_base *)plVar2;
        EVar11._M_node = (EVar11._M_node)->_M_next) {
      p_Var20 = EVar11._M_node[6]._M_prev;
      p_Var16 = p_Var20[2]._M_prev[0xf]._M_prev;
      iVar18 = 0;
      p_Var12 = p_Var16;
      do {
        iVar18 = iVar18 + (*(byte *)&p_Var12[3]._M_prev[0xc]._M_next ^ 1);
        p_Var12 = p_Var12[1]._M_prev[2]._M_next;
      } while (p_Var16 != p_Var12);
      p_Var16 = p_Var20[1]._M_prev[2]._M_prev[0xf]._M_prev;
      iVar8 = 0;
      p_Var12 = p_Var16;
      do {
        iVar8 = iVar8 + (*(byte *)&p_Var12[3]._M_prev[0xc]._M_next ^ 1);
        p_Var12 = p_Var12[1]._M_prev[2]._M_next;
      } while (p_Var16 != p_Var12);
      p_Var16 = p_Var20[2]._M_next[2]._M_next[2]._M_prev[0xf]._M_prev;
      iVar9 = 0;
      p_Var12 = p_Var16;
      do {
        iVar9 = iVar9 + (*(byte *)&p_Var12[3]._M_prev[0xc]._M_next ^ 1);
        p_Var12 = p_Var12[1]._M_prev[2]._M_next;
      } while (p_Var16 != p_Var12);
      p_Var20 = p_Var20[1]._M_prev[2]._M_next[2]._M_next[2]._M_prev[0xf]._M_prev;
      iVar10 = 0;
      p_Var16 = p_Var20;
      do {
        iVar10 = iVar10 + (*(byte *)&p_Var16[3]._M_prev[0xc]._M_next ^ 1);
        p_Var16 = p_Var16[1]._M_prev[2]._M_next;
      } while (p_Var20 != p_Var16);
      iVar1 = iVar18 + -6;
      iVar6 = -iVar1;
      if (0 < iVar1) {
        iVar6 = iVar1;
      }
      iVar1 = iVar8 + -6;
      iVar17 = -iVar1;
      if (0 < iVar1) {
        iVar17 = iVar1;
      }
      iVar1 = iVar9 + -6;
      iVar15 = -iVar1;
      if (0 < iVar1) {
        iVar15 = iVar1;
      }
      iVar1 = iVar10 + -6;
      iVar14 = -iVar1;
      if (0 < iVar1) {
        iVar14 = iVar1;
      }
      uVar13 = iVar14 + iVar15 + iVar17 + iVar6;
      iVar18 = iVar18 + -7;
      iVar1 = -iVar18;
      if (0 < iVar18) {
        iVar1 = iVar18;
      }
      iVar8 = iVar8 + -7;
      iVar18 = -iVar8;
      if (0 < iVar8) {
        iVar18 = iVar8;
      }
      iVar9 = iVar9 + -5;
      iVar8 = -iVar9;
      if (0 < iVar9) {
        iVar8 = iVar9;
      }
      iVar10 = iVar10 + -5;
      iVar9 = -iVar10;
      if (0 < iVar10) {
        iVar9 = iVar10;
      }
      if ((uint)(iVar9 + iVar8 + iVar18 + iVar1) < uVar13) {
        HalfedgeMesh::flipEdge((HalfedgeMesh *)(ulong)uVar13,EVar11);
      }
    }
    p_Var20 = (plVar3->super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>)._M_impl.
              _M_node.super__List_node_base._M_next;
    if (p_Var20 != (_List_node_base *)plVar3) {
      do {
        Vertex::normal(&local_60,(Vertex *)(p_Var20 + 1));
        (*(code *)(p_Var20[1]._M_next)->_M_next)(&local_48,(Vertex *)(p_Var20 + 1));
        p_Var16 = p_Var20[2]._M_prev;
        dVar5 = local_38 - (double)p_Var16;
        p_Var12 = p_Var20[2]._M_next;
        dVar21 = local_48 - (double)p_Var20[1]._M_prev;
        dVar23 = dStack_40 - (double)p_Var12;
        dVar24 = local_60.z * dVar5 + local_60.x * dVar21 + dVar23 * local_60.y;
        p_Var20[4]._M_prev =
             (_List_node_base *)((dVar21 - dVar24) * 0.2 + (double)p_Var20[1]._M_prev);
        p_Var20[5]._M_next = (_List_node_base *)((dVar23 - dVar24) * 0.2 + (double)p_Var12);
        p_Var20[5]._M_prev = (_List_node_base *)((dVar5 - dVar24) * 0.2 + (double)p_Var16);
        p_Var20 = p_Var20->_M_next;
      } while (p_Var20 != (_List_node_base *)plVar3);
      p_Var20 = (plVar3->super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>)._M_impl.
                _M_node.super__List_node_base._M_next;
    }
    for (; p_Var20 != (_List_node_base *)plVar3; p_Var20 = p_Var20->_M_next) {
      p_Var20[2]._M_prev = p_Var20[5]._M_prev;
      p_Var16 = p_Var20[5]._M_next;
      p_Var20[1]._M_prev = p_Var20[4]._M_prev;
      p_Var20[2]._M_next = p_Var16;
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 5);
  return;
}

Assistant:

void MeshResampler::resample(HalfedgeMesh& mesh) {
	// TODO: (meshEdit)
	// Compute the mean edge length.
	double L = 0.0;
	for (EdgeIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++) {
		L += e->length();
	}
	L /= mesh.nEdges();

	// Repeat the four main steps for 5 or 6 iterations
	for (int i = 0; i < 5; i++) {
		// -> Split edges much longer than the target length (being careful about
		//    how the loop is written!)
		int n = mesh.nEdges();
		EdgeIter e = mesh.edgesBegin();
		for (int i = 0; i < n; i++) {
			if (e->length() > 4.0*L / 3.0) mesh.splitEdge(e);
			e++;
		}
		/*EdgeIter e_start = mesh.edgesBegin();
		EdgeIter e_end = mesh.edgesEnd();
		for (EdgeIter e = e_start; e != e_end; e++) {
			if (e->length() > 4.0*L / 3.0) mesh.splitEdge(e);
		}*/

		// -> Collapse edges much shorter than the target length.  Here we need to
		//    be EXTRA careful about advancing the loop, because many edges may have
		//    been destroyed by a collapse (which ones?)
		e = mesh.edgesBegin();
		//EdgeIter e = mesh.edgesBegin();
		EdgeIter e_next = e;
		bool keep_going = true;
		while (keep_going){
			if (e->length() < 4.0*L / 5.0) {
				HalfedgeIter halfedge1 = e->halfedge();
				HalfedgeIter halfedge2 = e->halfedge()->twin();
				EdgeIter deleted_edge_1 = halfedge1->next()->next()->edge();
				EdgeIter deleted_edge_2 = halfedge2->next()->next()->edge();

				e_next = e;
				e_next++;
				while (e_next == deleted_edge_1 || e_next == deleted_edge_2) e_next++;
				if (e_next == mesh.edgesEnd()) keep_going = false;
				mesh.collapseEdge(e);
				e = e_next;
			}
			else {
				e++;
				if (e == mesh.edgesEnd()) keep_going = false;
			}
		}

		/*vector<EdgeIter> buffer;
		for (EdgeIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++) {
			if (e->length() < 4.0*L / 5.0) buffer.push_back(e); 
		}
		for (EdgeIter e: buffer) mesh.collapseEdge(e);*/

		/*EdgeIter e = mesh.edgesBegin();
		EdgeIter e_next = e;
		for (int i = 0; i < mesh.nEdges();i++) {
			e_next++;
			if (e->length() < 4.0*L / 5.0) mesh.collapseEdge(e);
			e = e_next;
		}*/

		// -> Now flip each edge if it improves vertex degree
		for (EdgeIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++) {
			int a1 = e->halfedge()->vertex()->degree();
			int a2 = e->halfedge()->twin()->vertex()->degree();
			int b1 = e->halfedge()->next()->next()->vertex()->degree();
			int b2 = e->halfedge()->twin()->next()->next()->vertex()->degree();
			int before = abs(a1 - 6) + abs(a2 - 6) + abs(b1 - 6) + abs(b2 - 6);
			int after = abs(a1 - 1 - 6) + abs(a2 - 1 - 6) + abs(b1 + 1 - 6) + abs(b2 + 1 - 6);
			if (after < before) mesh.flipEdge(e);
		}

		// -> Finally, apply some tangential smoothing to the vertex positions
		for (VertexIter ver = mesh.verticesBegin(); ver != mesh.verticesEnd(); ver++) {
			double w = 1.0 / 5.0;
			Vector3D N = ver->normal();
			Vector3D c = ver->centroid();
			Vector3D p = ver->position;
			Vector3D v = c - p;
			v = v - dot(N, v);
			ver->newPosition = p + w * v;
		}
		for (VertexIter ver = mesh.verticesBegin(); ver != mesh.verticesEnd(); ver++) {
			ver->position = ver->newPosition;
		}

	}
	//showError("resample() not implemented.");
}